

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  char *pcVar4;
  int i;
  int iVar5;
  reference rVar6;
  undefined1 local_c0 [8];
  fixed_t f;
  int nbFloors;
  int width;
  int nbRounds;
  int exitFloor;
  int nbTotalClones;
  int nbAdditionalElevators;
  int elevatorFloor;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [8];
  elevators_t e;
  int local_40;
  int exitPos;
  int nbElevators;
  uint local_34;
  int clonePos;
  int elevatorPos;
  
  piVar2 = (istream *)
           std::istream::operator>>
                     ((istream *)&std::cin,
                      (int *)&f.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage);
  piVar2 = (istream *)
           std::istream::operator>>
                     (piVar2,(int *)((long)&f.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                            super__Bvector_impl_data._M_end_of_storage + 4));
  piVar2 = (istream *)std::istream::operator>>(piVar2,&nbFloors);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&width);
  piVar2 = (istream *)
           std::istream::operator>>
                     (piVar2,(int *)((long)&e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage + 4));
  piVar2 = (istream *)std::istream::operator>>(piVar2,&nbRounds);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&exitFloor);
  std::istream::operator>>(piVar2,&local_40);
  std::istream::ignore();
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_60,(long)local_40 + 1,
             (allocator_type *)local_c0);
  _nbTotalClones = _nbTotalClones & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)local_40,(bool *)&nbTotalClones,
             (allocator_type *)&local_34);
  for (iVar5 = 0; iVar5 < local_40; iVar5 = iVar5 + 1) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&nbTotalClones);
    std::istream::operator>>(piVar2,(int *)&local_34);
    std::istream::ignore();
    *(uint *)((long)local_60 + (long)nbTotalClones * 4) = local_34;
  }
  *(int *)((long)local_60 + (long)local_40 * 4) =
       e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_;
  exitPos = -1;
  bVar1 = true;
  do {
    _nbTotalClones = (pointer)&local_70;
    _elevatorFloor = 0;
    local_70._M_local_buf[0] = '\0';
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_34);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&nbElevators);
    std::operator>>(piVar2,(string *)&nbTotalClones);
    std::istream::ignore();
    if (((long)(int)local_34 == 0xffffffffffffffff) ||
       (rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)(int)local_34),
       (*rVar6._M_p & rVar6._M_mask) != 0)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"WAIT");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      if (bVar1) {
        exitPos = nbElevators;
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_34);
      poVar3 = std::operator<<(poVar3,"/");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar5 = *(int *)((long)local_60 + (long)(int)local_34 * 4);
      if (nbElevators < iVar5) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&nbTotalClones,"RIGHT");
        if (!bVar1) {
          iVar5 = *(int *)((long)local_60 + (long)(int)local_34 * 4);
          goto LAB_001024ce;
        }
LAB_001024e5:
        poVar3 = std::operator<<((ostream *)&std::cout,"WAIT");
        std::endl<char,std::char_traits<char>>(poVar3);
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_c0,(long)(int)local_34);
        *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
      }
      else {
LAB_001024ce:
        if ((iVar5 < nbElevators) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&nbTotalClones,"LEFT"), bVar1)) goto LAB_001024e5;
        if ((int)local_34 < 1) {
          iVar5 = exitPos;
          if (local_34 == 0) goto joined_r0x0010253c;
LAB_0010253e:
          pcVar4 = "WAIT";
        }
        else {
          iVar5 = *(int *)((long)local_60 + ((ulong)local_34 - 1) * 4);
joined_r0x0010253c:
          pcVar4 = "BLOCK";
          if (nbElevators == iVar5) goto LAB_0010253e;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&nbTotalClones);
  } while( true );
}

Assistant:

int main()
{
    int nbFloors; // number of floors
    int width; // width of the area
    int nbRounds; // maximum number of rounds
    int exitFloor; // floor on which the exit is found
    int exitPos; // position of the exit on its floor
    int nbTotalClones; // number of generated clones
    int nbAdditionalElevators; // ignore (always zero)
    int nbElevators; // number of elevators
    cin >> nbFloors >> width >> nbRounds >> exitFloor >> exitPos >> nbTotalClones >> nbAdditionalElevators >> nbElevators; cin.ignore();
    
    typedef std::pair<int, int> pair_t;
    typedef std::vector<int> elevators_t;
    typedef std::vector<bool> fixed_t;
    
    elevators_t e(nbElevators + 1);
    fixed_t f(nbElevators, false);
    for (int i = 0; i < nbElevators; i++)
    {
        int elevatorFloor; // floor on which this elevator is found
        int elevatorPos; // position of the elevator on its floor
        cin >> elevatorFloor >> elevatorPos;
        cin.ignore();
        e[elevatorFloor] = elevatorPos;
    }
    e[nbElevators] = exitPos;
    
    bool first = true;
    int start = -1;
    while (1)
    {
        int cloneFloor; // floor of the leading clone
        int clonePos; // position of the leading clone on its floor
        string direction; // direction of the leading clone: LEFT or RIGHT
        cin >> cloneFloor >> clonePos >> direction; cin.ignore();

        if (-1 == cloneFloor || f[cloneFloor])
        {
            cout << "WAIT" << endl;
            continue;
        }
        if (first)
        {
            start = clonePos;
            first = false;
        }
        
        cerr << cloneFloor << "/" << e.size() << endl;
        if ((clonePos < e[cloneFloor] && direction == "RIGHT")
            || (clonePos > e[cloneFloor] && direction == "LEFT"))
        {
            cout << "WAIT" << endl;
            f[cloneFloor] = true;
        } else
        {
            if ((0 < cloneFloor && clonePos != e[cloneFloor - 1])
                || (0 == cloneFloor && clonePos != start))
            {
                cout << "BLOCK" << endl;
            }
            else
            {
                cout << "WAIT" << endl;
            }
        }
    }
}